

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::
setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,size_t count)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  BufHdr *pBVar5;
  BufHdr *pBVar6;
  ulong in_RSI;
  BufHdr *in_RDI;
  wchar_t *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  RefCount **in_stack_ffffffffffffff98;
  BufHdr *in_stack_ffffffffffffffa0;
  Ptr local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  Construct in_stack_ffffffffffffffdf;
  bool local_1;
  
  if (((Hdr *)(in_RDI->super_RefCount).m_freeFunc != (Hdr *)0x0) &&
     (sVar4 = rc::RefCount::getRefCount((RefCount *)(in_RDI->super_RefCount).m_freeFunc), sVar4 == 1
     )) {
    if (*(ulong *)&(in_RDI->super_RefCount).m_refCount == in_RSI) {
      return true;
    }
    if (in_RSI << 2 <= ((Hdr *)(in_RDI->super_RefCount).m_freeFunc)->m_bufferSize) {
      if (*(ulong *)&(in_RDI->super_RefCount).m_refCount < in_RSI) {
        SimpleArrayDetails<wchar_t>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffffdf,
                   (wchar_t *)
                   ((long)(in_RDI->super_RefCount)._vptr_RefCount +
                   *(size_t *)&(in_RDI->super_RefCount).m_refCount * 4),
                   in_RSI - *(size_t *)&(in_RDI->super_RefCount).m_refCount);
      }
      else {
        SimpleArrayDetails<wchar_t>::destruct
                  ((wchar_t *)((long)(in_RDI->super_RefCount)._vptr_RefCount + in_RSI * 4),
                   *(size_t *)&(in_RDI->super_RefCount).m_refCount - in_RSI);
      }
      SimpleArrayDetails<wchar_t>::setHdrCount((Hdr *)(in_RDI->super_RefCount).m_freeFunc,in_RSI);
      *(ulong *)&(in_RDI->super_RefCount).m_refCount = in_RSI;
      return true;
    }
  }
  if (in_RSI == 0) {
    ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::release
              ((ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)in_RDI);
    local_1 = true;
  }
  else if (*(size_t *)&(in_RDI->super_RefCount).m_refCount == 0) {
    bVar3 = reserve((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)
                    CONCAT17(in_stack_ffffffffffffffdf,
                             CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                    in_stack_ffffffffffffffd0);
    if (bVar3) {
      SimpleArrayDetails<wchar_t>::Construct::operator()
                ((Construct *)&stack0xffffffffffffffdd,
                 (wchar_t *)(in_RDI->super_RefCount)._vptr_RefCount,in_RSI);
      SimpleArrayDetails<wchar_t>::setHdrCount((Hdr *)(in_RDI->super_RefCount).m_freeFunc,in_RSI);
      *(ulong *)&(in_RDI->super_RefCount).m_refCount = in_RSI;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    getAllocSize(0x12da7c);
    pBVar5 = (BufHdr *)mem::allocate(0x12da8f);
    rc::BufHdr::BufHdr(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,(uintptr_t)in_RDI
                      );
    rc::primeRefCount<axl::rc::BufHdr>(in_RDI,(FreeFunc *)pBVar5);
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>((Ptr<axl::rc::BufHdr> *)in_RDI,pBVar5);
    pBVar6 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    if (pBVar6 == (BufHdr *)0x0) {
      local_1 = false;
    }
    else {
      pBVar6 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      SimpleArrayDetails<wchar_t>::setHdrCount(pBVar6,in_RSI);
      pBVar6 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      pBVar6 = pBVar6 + 1;
      uVar1._0_4_ = (in_RDI->super_RefCount).m_refCount;
      uVar1._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
      if (uVar1 < in_RSI) {
        SimpleArrayDetails<wchar_t>::constructCopy((wchar_t *)in_RDI,(wchar_t *)pBVar5,0x12db6d);
        lVar2 = *(long *)&(in_RDI->super_RefCount).m_refCount;
        SimpleArrayDetails<wchar_t>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffff9f,
                   (wchar_t *)((long)&(pBVar6->super_RefCount)._vptr_RefCount + lVar2 * 4),
                   in_RSI - lVar2);
      }
      else {
        SimpleArrayDetails<wchar_t>::constructCopy((wchar_t *)in_RDI,(wchar_t *)pBVar5,0x12db36);
      }
      rc::RefCount::release(&in_RDI->super_RefCount);
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pBVar6;
      pBVar5 = rc::Ptr<axl::rc::BufHdr>::detach
                         ((Ptr<axl::rc::BufHdr> *)pBVar6,in_stack_ffffffffffffff98);
      (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar5;
      (in_RDI->super_RefCount).m_refCount = (int)in_RSI;
      (in_RDI->super_RefCount).m_weakRefCount = (int)(in_RSI >> 0x20);
      local_1 = true;
    }
    rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x12dbee);
  }
  return local_1;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}